

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O1

map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> * __thiscall
LargeGapGrayCode::computeRunLengths
          (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *__return_storage_ptr__,LargeGapGrayCode *this,int bitWidth)

{
  _Rb_tree_header *p_Var1;
  undefined1 *puVar2;
  int iVar3;
  int iVar4;
  _Base_ptr p_Var5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  int runThrough;
  int iVar11;
  ulong uVar12;
  undefined1 local_70 [8];
  vector<int,_std::allocator<int>_> transitionLastSeen;
  vector<int,_std::allocator<int>_> t;
  allocator_type local_31;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (this->m_transitionSequences).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + ((long)bitWidth - 1));
  t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)CONCAT44(t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_70,(long)bitWidth,
             (value_type_conflict1 *)
             &t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,&local_31);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar11 = 1;
  do {
    if ((long)t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start -
        (long)transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != 0) {
      uVar8 = (long)t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start -
              (long)transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage >> 2;
      uVar12 = 0;
      do {
        iVar3 = transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[uVar12];
        iVar4 = *(int *)((long)local_70 + (long)iVar3 * 4);
        if (iVar4 == -1) {
          *(int *)((long)local_70 + (long)iVar3 * 4) = (int)uVar12;
        }
        else {
          iVar6 = (int)uVar8 * iVar11 + (int)uVar12;
          *(int *)((long)local_70 + (long)iVar3 * 4) = iVar6;
          if (iVar11 == 2) {
            uVar7 = iVar6 - iVar4;
            p_Var5 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
            p_Var9 = &p_Var1->_M_header;
            for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
                p_Var5 = (&p_Var5->_M_left)[(int)*(size_t *)(p_Var5 + 1) < (int)uVar7]) {
              if ((int)uVar7 <= (int)*(size_t *)(p_Var5 + 1)) {
                p_Var9 = p_Var5;
              }
            }
            p_Var10 = p_Var1;
            if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
               (p_Var10 = (_Rb_tree_header *)p_Var9,
               (int)uVar7 < (int)((_Rb_tree_header *)p_Var9)->_M_node_count)) {
              p_Var10 = p_Var1;
            }
            if (p_Var10 == p_Var1) {
              t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = (pointer)((ulong)uVar7 | 0x100000000);
              std::
              _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              ::_M_emplace_unique<std::pair<int,int>>
                        ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                          *)__return_storage_ptr__,
                         (pair<int,_int> *)
                         &t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
            }
            else {
              puVar2 = (undefined1 *)((long)&p_Var10->_M_node_count + 4);
              *(int *)puVar2 = *(int *)puVar2 + 1;
            }
          }
        }
        uVar12 = uVar12 + 1;
        uVar8 = (long)t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start -
                (long)transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage >> 2;
      } while (uVar12 < uVar8);
    }
    iVar11 = iVar11 + 1;
  } while (iVar11 != 3);
  if (local_70 != (undefined1  [8])0x0) {
    operator_delete((void *)local_70);
  }
  if (transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<int, int> LargeGapGrayCode::computeRunLengths(int bitWidth)
{
	std::vector<int> t = m_transitionSequences[bitWidth-1];
	std::vector<int> transitionLastSeen(bitWidth, -1);

	std::map<int, int> numRunLengths;

	for(int runThrough = 1; runThrough <= 2; ++runThrough) {
		for(int i = 0; i < t.size(); ++i) {
			if(transitionLastSeen[t[i]] == -1) {
				transitionLastSeen[t[i]] = i;
			}
			else {
				int runLength = runThrough*t.size()+i-transitionLastSeen[t[i]];
				transitionLastSeen[t[i]] = runThrough*t.size()+i;

				if(runThrough == 2) {
					std::map<int, int>::iterator it = numRunLengths.find(runLength);
					if (it != numRunLengths.end()) {
					    it->second += 1;
					}
					else {
						numRunLengths.insert(std::make_pair(runLength, 1));
					}
				}
			}
		}
	}

	return numRunLengths;
}